

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

void __thiscall cmCacheManager::PrintCache(cmCacheManager *this,ostream *out)

{
  char cVar1;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"=================================================",0x31);
  cVar1 = (char)out;
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"CMakeCache Contents:",0x14);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  for (p_Var3 = (this->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->Cache)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[3]._M_color != 4) {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,*(char **)(p_Var3 + 2),(long)p_Var3[2]._M_parent);
      std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"To change values in the CMakeCache, ",0x24);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"edit CMakeCache.txt in your output directory.\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"=================================================",0x31);
  std::ios::widen((char)out->_vptr_basic_ostream[-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void cmCacheManager::PrintCache(std::ostream& out) const
{
  out << "=================================================" << std::endl;
  out << "CMakeCache Contents:" << std::endl;
  for(std::map<std::string, CacheEntry>::const_iterator i =
        this->Cache.begin(); i != this->Cache.end(); ++i)
    {
    if((*i).second.Type != cmState::INTERNAL)
      {
      out << (*i).first << " = " << (*i).second.Value
          << std::endl;
      }
    }
  out << "\n\n";
  out << "To change values in the CMakeCache, "
    << std::endl << "edit CMakeCache.txt in your output directory.\n";
  out << "=================================================" << std::endl;
}